

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O0

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  NetTypeDeclarationSyntax *pNVar1;
  Token TVar2;
  Token TVar3;
  BumpAllocator *unaff_retaddr;
  Token *in_stack_00000010;
  BumpAllocator *in_stack_00000038;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_stack_00000040;
  BumpAllocator *in_stack_000000d8;
  Token *in_stack_000000e0;
  BumpAllocator *in_stack_ffffffffffffff88;
  WithFunctionClauseSyntax *in_stack_ffffffffffffff90;
  Info *args_4;
  
  deepClone<slang::syntax::AttributeInstanceSyntax>(in_stack_00000040,in_stack_00000038);
  TVar2 = parsing::Token::deepClone(in_stack_000000e0,in_stack_000000d8);
  not_null<slang::syntax::DataTypeSyntax_*>::operator*
            ((not_null<slang::syntax::DataTypeSyntax_*> *)0x28641b);
  deepClone<slang::syntax::DataTypeSyntax>
            ((DataTypeSyntax *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  TVar3 = parsing::Token::deepClone(in_stack_000000e0,in_stack_000000d8);
  args_4 = TVar3.info;
  if (*(long *)&(((SyntaxList<slang::syntax::AttributeInstanceSyntax> *)((long)__fn + 0x70))->
                super_SyntaxListBase).super_SyntaxNode != 0) {
    deepClone<slang::syntax::WithFunctionClauseSyntax>
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  }
  parsing::Token::deepClone(in_stack_000000e0,in_stack_000000d8);
  pNVar1 = BumpAllocator::
           emplace<slang::syntax::NetTypeDeclarationSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::syntax::DataTypeSyntax&,slang::parsing::Token,slang::syntax::WithFunctionClauseSyntax*,slang::parsing::Token>
                     (unaff_retaddr,(SyntaxList<slang::syntax::AttributeInstanceSyntax> *)__fn,
                      (Token *)__child_stack,(DataTypeSyntax *)TVar2.info,TVar2._0_8_,
                      (WithFunctionClauseSyntax **)args_4,in_stack_00000010);
  return (int)pNVar1;
}

Assistant:

static SyntaxNode* clone(const NetTypeDeclarationSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<NetTypeDeclarationSyntax>(
        *deepClone(node.attributes, alloc),
        node.keyword.deepClone(alloc),
        *deepClone<DataTypeSyntax>(*node.type, alloc),
        node.name.deepClone(alloc),
        node.withFunction ? deepClone(*node.withFunction, alloc) : nullptr,
        node.semi.deepClone(alloc)
    );
}